

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayEqualFailureIncludesCheckExpectedAndActual::RunImpl
          (TestCheckArrayEqualFailureIncludesCheckExpectedAndActual *this)

{
  TestResults *pTVar1;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  char *pcVar5;
  TestDetails local_938 [2];
  TestDetails local_8f8 [2];
  TestDetails local_8b8;
  int local_898 [2];
  int data2 [4];
  int data1 [4];
  ScopedCurrentTest scopedResults;
  undefined1 local_858 [8];
  TestResults testResults;
  RecordingReporter reporter;
  TestCheckArrayEqualFailureIncludesCheckExpectedAndActual *this_local;
  
  reporter._2088_8_ = this;
  RecordingReporter::RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  UnitTest::TestResults::TestResults
            ((TestResults *)local_858,(TestReporter *)&testResults.m_failureCount);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)(data1 + 2),(TestResults *)local_858,(TestDetails *)0x0);
  data2[2] = 0;
  data2[3] = 1;
  data1[0] = 2;
  data1[1] = 3;
  local_898[0] = 0;
  local_898[1] = 1;
  data2[0] = 3;
  data2[1] = 3;
  ppTVar3 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar3;
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8b8,*ppTVar4,0x20b);
  UnitTest::CheckArrayEqual<int[4],int[4]>
            (pTVar1,(int (*) [4])(data2 + 2),(int (*) [4])local_898,4,&local_8b8);
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)(data1 + 2));
  pcVar5 = strstr(reporter.lastFailedTest + 0xf8,"xpected [ 0 1 2 3 ]");
  bVar2 = UnitTest::Check<char*>(pcVar5);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_8f8,*ppTVar4,0x20e);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_8f8,"strstr(reporter.lastFailedMessage, \"xpected [ 0 1 2 3 ]\")");
  }
  pcVar5 = strstr(reporter.lastFailedTest + 0xf8,"was [ 0 1 3 3 ]");
  bVar2 = UnitTest::Check<char*>(pcVar5);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_938,*ppTVar4,0x20f);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_938,"strstr(reporter.lastFailedMessage, \"was [ 0 1 3 3 ]\")");
  }
  RecordingReporter::~RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  return;
}

Assistant:

TEST(CheckArrayEqualFailureIncludesCheckExpectedAndActual)
{
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		int const data1[4] = { 0, 1, 2, 3 };
        int const data2[4] = { 0, 1, 3, 3 };
        CHECK_ARRAY_EQUAL (data1, data2, 4);
    }

    CHECK(strstr(reporter.lastFailedMessage, "xpected [ 0 1 2 3 ]"));
    CHECK(strstr(reporter.lastFailedMessage, "was [ 0 1 3 3 ]"));
}